

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

MolecularGraph_p __thiscall indigox::Molecule::GetMolecularGraph(Molecule *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<indigox::MolecularGraph> *in_RSI;
  element_type *in_RDI;
  MolecularGraph_p MVar1;
  
  std::shared_ptr<indigox::MolecularGraph>::shared_ptr
            (in_RSI,(shared_ptr<indigox::MolecularGraph> *)in_RDI);
  MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (MolecularGraph_p)
         MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MolecularGraph_p Molecule::GetMolecularGraph() { return graph_; }